

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  uint uVar1;
  undefined8 *puVar2;
  Rep *pRVar3;
  ulong uVar4;
  string *psVar5;
  ulong uVar6;
  RepeatedPtrFieldBase *pRVar7;
  LogMessageFatal aLStack_28 [16];
  
  uVar1 = this->current_size_;
  pRVar7 = this;
  if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
    pRVar3 = rep(this);
    pRVar7 = (RepeatedPtrFieldBase *)pRVar3->elements;
  }
  if ((int)uVar1 < 1) {
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)(int)uVar1,0,"n > 0");
  }
  else {
    psVar5 = (string *)0x0;
  }
  if (psVar5 == (string *)0x0) {
    uVar4 = 1;
    if (1 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    uVar6 = 0;
    do {
      puVar2 = (undefined8 *)(&pRVar7->tagged_rep_or_elem_)[uVar6];
      uVar6 = uVar6 + 1;
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    } while (uVar4 != uVar6);
    this->current_size_ = 0;
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,0x2a8,*(undefined8 *)(psVar5 + 8),*(undefined8 *)psVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
}

Assistant:

PROTOBUF_NOINLINE void ClearNonEmpty() {
    const int n = current_size_;
    void* const* elems = elements();
    int i = 0;
    ABSL_DCHECK_GT(n, 0);
    // do/while loop to avoid initial test because we know n > 0
    do {
      TypeHandler::Clear(cast<TypeHandler>(elems[i++]));
    } while (i < n);
    ExchangeCurrentSize(0);
  }